

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall efsw::Thread::~Thread(Thread *this)

{
  void *in_RSI;
  
  this->_vptr_Thread = (_func_int **)&PTR__Thread_0011ec08;
  wait(this,in_RSI);
  if (this->mEntryPoint != (ThreadFunc *)0x0) {
    (*this->mEntryPoint->_vptr_ThreadFunc[1])();
    this->mEntryPoint = (ThreadFunc *)0x0;
  }
  return;
}

Assistant:

Thread::~Thread() {
	wait();

	efSAFE_DELETE( mEntryPoint );
}